

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.hpp
# Opt level: O0

bool jsoncons::
     order_preserving_json_object<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::vector>
     ::compare1(index_key_value<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                *item1,index_key_value<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                       *item2)

{
  int iVar1;
  long in_RSI;
  string *in_RDI;
  int comp;
  bool local_1;
  
  iVar1 = std::__cxx11::string::compare(in_RDI);
  if (iVar1 < 0) {
    local_1 = true;
  }
  else if (iVar1 == 0) {
    local_1 = *(long *)(in_RDI + 0x20) < *(long *)(in_RSI + 0x20);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

static bool compare1(const index_key_value<Json>& item1, const index_key_value<Json>& item2)
        {
            int comp = item1.name.compare(item2.name); 
            if (comp < 0) return true;
            if (comp == 0) return item1.index < item2.index;

            return false;
        }